

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ArrayJoinPromiseNodeBase::Branch::~Branch(Branch *this)

{
  Branch *this_local;
  
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&this->dependency);
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::Branch::~Branch() noexcept(false) {}